

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall
HModel::util_chgCostsSet(HModel *this,int ncols,int *XcolCostIndex,double *XcolCostValues)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  pdVar1 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar3 = (ulong)(uint)ncols;
  if (ncols < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pdVar1[XcolCostIndex[uVar4]] = XcolCostValues[uVar4] * pdVar2[XcolCostIndex[uVar4]];
  }
  mlFg_Update(this,this->mlFg_action_NewCosts);
  return 0;
}

Assistant:

int HModel::util_chgCostsSet(int ncols, const int* XcolCostIndex, const double* XcolCostValues) {
  assert(XcolCostIndex != NULL);
  assert(XcolCostValues != NULL);
  for (int ix = 0; ix < ncols; ++ix) {
    int col = XcolCostIndex[ix];
    assert(0 <= col);
    assert(col < numCol);
    colCost[col] =  XcolCostValues[ix] * colScale[col];
  }
  //Deduce the consequences of new costs
  mlFg_Update(mlFg_action_NewCosts);
  return 0;
}